

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddRef.c
# Opt level: O2

int cuddIsInDeathRow(DdManager *dd,DdNode *f)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = 0;
  uVar2 = (ulong)(uint)dd->deathRowDepth;
  if (dd->deathRowDepth < 1) {
    uVar2 = uVar1;
  }
  while( true ) {
    if (uVar2 == uVar1) {
      return -1;
    }
    if (dd->deathRow[uVar1] == f) break;
    uVar1 = uVar1 + 1;
  }
  return (int)uVar1;
}

Assistant:

int
cuddIsInDeathRow(
  DdManager *dd,
  DdNode *f)
{
#ifndef DD_NO_DEATH_ROW
    int i;

    for (i = 0; i < dd->deathRowDepth; i++) {
        if (f == dd->deathRow[i]) {
            return(i);
        }
    }
#endif

    return(-1);

}